

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall
re2::Regexp::ParseState::ParseCharClass
          (ParseState *this,StringPiece *s,Regexp **out_re,RegexpStatus *status)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  ParseStatus PVar7;
  Regexp *this_00;
  CharClassBuilder *pCVar8;
  UGroup *g;
  ParseFlags parse_flags;
  RuneRange RVar9;
  int iVar10;
  char *pcVar11;
  RuneRange rr;
  StringPiece whole_class;
  Rune r;
  
  whole_class.ptr_ = s->ptr_;
  whole_class.length_ = s->length_;
  whole_class._12_4_ = *(undefined4 *)&s->field_0xc;
  if ((s->length_ == 0) || (*s->ptr_ != '[')) {
    status->code_ = kRegexpInternalError;
    (status->error_arg_).ptr_ = (char *)0x0;
    (status->error_arg_).length_ = 0;
  }
  else {
    this_00 = (Regexp *)operator_new(0x28);
    Regexp(this_00,kRegexpCharClass,this->flags_ & ~FoldCase);
    pCVar8 = (CharClassBuilder *)operator_new(0x40);
    CharClassBuilder::CharClassBuilder(pCVar8);
    (this_00->field_7).field_3.ccb_ = pCVar8;
    pcVar3 = s->ptr_;
    pcVar11 = pcVar3 + 1;
    s->ptr_ = pcVar11;
    iVar10 = s->length_;
    s->length_ = iVar10 + -1;
    if ((iVar10 < 2) || (*pcVar11 != '^')) {
      bVar5 = false;
    }
    else {
      s->ptr_ = pcVar3 + 2;
      s->length_ = iVar10 + -2;
      bVar5 = true;
      if ((this->flags_ & (NeverNL|ClassNL)) != ClassNL) {
        CharClassBuilder::AddRange(pCVar8,10,10);
      }
    }
    bVar4 = 1;
    while( true ) {
      uVar2 = s->length_;
      if ((long)(int)uVar2 < 1) break;
      RVar9 = (RuneRange)s->ptr_;
      cVar1 = *(char *)RVar9;
      if ((bool)(~bVar4 & cVar1 == ']')) goto LAB_0011249d;
      if (!(bool)(bVar4 | cVar1 != '-')) {
        if (((this->flags_ & PerlX) != NoParseFlags) ||
           ((uVar2 != 1 && (*(char *)((long)RVar9 + 1) == ']')))) goto LAB_001123e2;
        rr = (RuneRange)((long)s->ptr_ + 1);
        iVar10 = StringPieceToRune(&r,(StringPiece *)&rr,status);
        if (iVar10 < 0) goto LAB_00112515;
        status->code_ = kRegexpBadCharRange;
        (status->error_arg_).ptr_ = s->ptr_;
        iVar10 = iVar10 + 1;
        goto LAB_00112511;
      }
      if (cVar1 == '[' && 2 < uVar2) {
        if (*(char *)((long)RVar9 + 1) != ':') goto LAB_001123e2;
        parse_flags = this->flags_;
        pCVar8 = (this_00->field_7).field_3.ccb_;
        iVar10 = 4;
        for (pcVar11 = (char *)((long)RVar9 + 2);
            pcVar11 <= (char *)((long)RVar9 + (long)(int)uVar2) + -2; pcVar11 = pcVar11 + 1) {
          if ((*pcVar11 == ':') && (pcVar11[1] == ']')) {
            rr = RVar9;
            g = LookupGroup((StringPiece *)&rr,(UGroup *)posix_groups,0x1c);
            if (g != (UGroup *)0x0) {
              s->ptr_ = s->ptr_ + iVar10;
              s->length_ = s->length_ - iVar10;
              iVar10 = g->sign;
              goto LAB_00112401;
            }
            status->code_ = kRegexpBadCharRange;
            (status->error_arg_).ptr_ = (char *)rr;
            goto LAB_00112511;
          }
          iVar10 = iVar10 + 1;
        }
      }
      if ((cVar1 != '\\' || (int)uVar2 < 3) || ((*(byte *)((long)RVar9 + 1) | 0x20) != 0x70))
      goto LAB_001123e2;
      PVar7 = ParseUnicodeGroup(s,this->flags_,(this_00->field_7).field_3.ccb_,status);
      bVar4 = 0;
      if (PVar7 != kParseOk) {
        if (PVar7 == kParseError) goto LAB_00112515;
LAB_001123e2:
        g = MaybeParsePerlCCEscape(s,this->flags_);
        if (g == (UGroup *)0x0) {
          rr.lo = 0;
          rr.hi = 0;
          bVar6 = ParseCCRange(this,s,&rr,&whole_class,status);
          if (!bVar6) goto LAB_00112515;
          CharClassBuilder::AddRangeFlags
                    ((this_00->field_7).field_3.ccb_,rr.lo,rr.hi,this->flags_ | ClassNL);
          bVar4 = 0;
        }
        else {
          pCVar8 = (this_00->field_7).field_3.ccb_;
          iVar10 = g->sign;
          parse_flags = this->flags_;
LAB_00112401:
          AddUGroup(pCVar8,g,iVar10,parse_flags);
          bVar4 = 0;
        }
      }
    }
    if (uVar2 != 0) {
      RVar9 = (RuneRange)s->ptr_;
LAB_0011249d:
      s->ptr_ = (char *)((long)RVar9 + 1);
      s->length_ = uVar2 - 1;
      if (bVar5) {
        CharClassBuilder::Negate((this_00->field_7).field_3.ccb_);
      }
      *out_re = this_00;
      return true;
    }
    status->code_ = kRegexpMissingBracket;
    (status->error_arg_).ptr_ = whole_class.ptr_;
    iVar10 = whole_class.length_;
LAB_00112511:
    (status->error_arg_).length_ = iVar10;
LAB_00112515:
    Decref(this_00);
  }
  return false;
}

Assistant:

bool Regexp::ParseState::ParseCharClass(StringPiece* s,
                                        Regexp** out_re,
                                        RegexpStatus* status) {
  StringPiece whole_class = *s;
  if (s->size() == 0 || (*s)[0] != '[') {
    // Caller checked this.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(NULL);
    return false;
  }
  bool negated = false;
  Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
  re->ccb_ = new CharClassBuilder;
  s->remove_prefix(1);  // '['
  if (s->size() > 0 && (*s)[0] == '^') {
    s->remove_prefix(1);  // '^'
    negated = true;
    if (!(flags_ & ClassNL) || (flags_ & NeverNL)) {
      // If NL can't match implicitly, then pretend
      // negated classes include a leading \n.
      re->ccb_->AddRange('\n', '\n');
    }
  }
  bool first = true;  // ] is okay as first char in class
  while (s->size() > 0 && ((*s)[0] != ']' || first)) {
    // - is only okay unescaped as first or last in class.
    // Except that Perl allows - anywhere.
    if ((*s)[0] == '-' && !first && !(flags_&PerlX) &&
        (s->size() == 1 || (*s)[1] != ']')) {
      StringPiece t = *s;
      t.remove_prefix(1);  // '-'
      Rune r;
      int n = StringPieceToRune(&r, &t, status);
      if (n < 0) {
        re->Decref();
        return false;
      }
      status->set_code(kRegexpBadCharRange);
      status->set_error_arg(StringPiece(s->data(), 1+n));
      re->Decref();
      return false;
    }
    first = false;

    // Look for [:alnum:] etc.
    if (s->size() > 2 && (*s)[0] == '[' && (*s)[1] == ':') {
      switch (ParseCCName(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Unicode character group like \p{Han}
    if (s->size() > 2 &&
        (*s)[0] == '\\' &&
        ((*s)[1] == 'p' || (*s)[1] == 'P')) {
      switch (ParseUnicodeGroup(s, flags_, re->ccb_, status)) {
        case kParseOk:
          continue;
        case kParseError:
          re->Decref();
          return false;
        case kParseNothing:
          break;
      }
    }

    // Look for Perl character class symbols (extension).
    const UGroup *g = MaybeParsePerlCCEscape(s, flags_);
    if (g != NULL) {
      AddUGroup(re->ccb_, g, g->sign, flags_);
      continue;
    }

    // Otherwise assume single character or simple range.
    RuneRange rr;
    if (!ParseCCRange(s, &rr, whole_class, status)) {
      re->Decref();
      return false;
    }
    // AddRangeFlags is usually called in response to a class like
    // \p{Foo} or [[:foo:]]; for those, it filters \n out unless
    // Regexp::ClassNL is set.  In an explicit range or singleton
    // like we just parsed, we do not filter \n out, so set ClassNL
    // in the flags.
    re->ccb_->AddRangeFlags(rr.lo, rr.hi, flags_ | Regexp::ClassNL);
  }
  if (s->size() == 0) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    re->Decref();
    return false;
  }
  s->remove_prefix(1);  // ']'

  if (negated)
    re->ccb_->Negate();

  *out_re = re;
  return true;
}